

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O2

unique_ptr<Catch::TestSpec::TagPattern> __thiscall
Catch::Detail::make_unique<Catch::TestSpec::TagPattern,char_const(&)[2],std::__cxx11::string&>
          (Detail *this,char (*args) [2],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  TagPattern *this_00;
  allocator<char> local_41;
  string local_40;
  
  this_00 = (TagPattern *)operator_new(0x48);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,*args,&local_41);
  TestSpec::TagPattern::TagPattern(this_00,&local_40,args_1);
  *(TagPattern **)this = this_00;
  std::__cxx11::string::~string((string *)&local_40);
  return (unique_ptr<Catch::TestSpec::TagPattern>)(TagPattern *)this;
}

Assistant:

unique_ptr<T> make_unique(Args&&... args) {
        // static_cast<Args&&> does the same thing as std::forward in
        // this case, but does not require including big header (<utility>)
        // and compiles faster thanks to not requiring template instantiation
        // and overload resolution
        return unique_ptr<T>(new T(static_cast<Args&&>(args)...));
    }